

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O2

MPP_RET mpp_service_reg_offsets(void *ctx,MppDevRegOffCfgs *cfgs)

{
  uint uVar1;
  long lVar2;
  MPP_RET MVar3;
  ulong uVar4;
  RegOffsetInfo *pRVar5;
  MppDevMppService *p;
  undefined8 in_R9;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  uVar1 = cfgs->count;
  uVar4 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    if ((int)(*(int *)((long)ctx + 0x44) + uVar1) < 0x40 && *(int *)((long)ctx + 0x44) < 0x40) {
      uVar9 = uVar4;
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        for (lVar7 = 0; (int)lVar7 < *(int *)((long)ctx + 0x44); lVar7 = lVar7 + 1) {
          lVar2 = *(long *)((long)ctx + 0x38);
          lVar8 = *(int *)((long)ctx + 0x48) + lVar7;
          uVar1 = *(uint *)(lVar2 + lVar8 * 8);
          if (uVar1 == cfgs[lVar6 + 1].size) {
            uVar9 = CONCAT44((int)(uVar9 >> 0x20),cfgs[lVar6 + 1].count);
            _mpp_log_l(2,"mpp_serivce","reg[%d] offset has been set, cover old %d -> %d\n",
                       "mpp_service_reg_offsets",(ulong)uVar1,
                       (ulong)*(uint *)(lVar2 + 4 + lVar8 * 8),uVar9);
            *(RK_S32 *)(lVar2 + 4 + lVar8 * 8) = cfgs[lVar6 + 1].count;
          }
        }
        pRVar5 = mpp_service_next_reg_offset((MppDevMppService *)ctx);
        *pRVar5 = *(RegOffsetInfo *)(cfgs + lVar6 + 1);
        uVar4 = (ulong)(uint)cfgs->count;
      }
      MVar3 = MPP_OK;
    }
    else {
      _mpp_log_l(2,"mpp_serivce","reach max offset definition\n","mpp_service_reg_offsets",0x40,
                 in_R9,uVar4);
      MVar3 = MPP_NOK;
    }
    return MVar3;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_service_reg_offsets(void *ctx, MppDevRegOffCfgs *cfgs)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    RegOffsetInfo *info;
    RK_S32 i;

    if (cfgs->count <= 0)
        return MPP_OK;

    if (p->reg_offset_count >= MAX_REG_OFFSET ||
        p->reg_offset_count + cfgs->count >= MAX_REG_OFFSET) {
        mpp_err_f("reach max offset definition\n", MAX_REG_OFFSET);
        return MPP_NOK;
    }

    for (i = 0; i < cfgs->count; i++) {
        MppDevRegOffsetCfg *cfg = &cfgs->cfgs[i];
        RK_S32 j;

        for (j = 0; j < p->reg_offset_count; j++) {
            info = &p->reg_offset_info[p->reg_offset_pos + j];

            if (info->reg_idx == cfg->reg_idx) {
                mpp_err_f("reg[%d] offset has been set, cover old %d -> %d\n",
                          info->reg_idx, info->offset, cfg->offset);
                info->offset = cfg->offset;
                continue;
            }
        }

        info = mpp_service_next_reg_offset(p);;
        info->reg_idx = cfg->reg_idx;
        info->offset = cfg->offset;
    }

    return MPP_OK;
}